

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_max(lua_State *L)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int local_18;
  int i;
  int imax;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  local_18 = 1;
  if (iVar1 < 1) {
    luaL_argerror(L,1,"value expected");
  }
  for (local_1c = 2; local_1c <= iVar1; local_1c = local_1c + 1) {
    iVar2 = lua_compare(L,local_18,local_1c,1);
    if (iVar2 != 0) {
      local_18 = local_1c;
    }
  }
  lua_pushvalue(L,local_18);
  return 1;
}

Assistant:

static int math_max(lua_State *L) {
    int n = lua_gettop(L);  /* number of arguments */
    int imax = 1;  /* index of current maximum value */
    int i;
    luaL_argcheck(L, n >= 1, 1, "value expected");
    for (i = 2; i <= n; i++) {
        if (lua_compare(L, imax, i, LUA_OPLT))
            imax = i;
    }
    lua_pushvalue(L, imax);
    return 1;
}